

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O1

DescriptorFlags __thiscall
Js::CrossSiteObject<Js::JavascriptRegExp>::GetSetter
          (CrossSiteObject<Js::JavascriptRegExp> *this,PropertyId propertyId,Var *setterValue,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  DescriptorFlags DVar1;
  Var pvVar2;
  
  DVar1 = JavascriptRegExp::GetSetter
                    (&this->super_JavascriptRegExp,propertyId,setterValue,info,requestContext);
  if (((DVar1 & Accessor) != None) && (*setterValue != (Var)0x0)) {
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    pvVar2 = CrossSite::MarshalVar(requestContext,*setterValue,false);
    *setterValue = pvVar2;
  }
  return DVar1;
}

Assistant:

DescriptorFlags CrossSiteObject<T>::GetSetter(PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DescriptorFlags flags = __super::GetSetter(propertyId, setterValue, info, requestContext);
        if ((flags & Accessor) == Accessor && *setterValue)
        {
            PropertyValueInfo::SetNoCache(info, this);
            *setterValue = CrossSite::MarshalVar(requestContext, *setterValue);
        }
        return flags;
    }